

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRandom.cpp
# Opt level: O1

void anon_unknown.dwarf_e71d5::testGenerator<Imath_3_2::Rand48>(void)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Rand48 rand;
  int values [11];
  int diffs [23];
  ushort local_b6 [3];
  double local_b0;
  int local_a8 [14];
  int local_70 [24];
  
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_70[0] = 0;
  local_70[1] = 0;
  local_70[2] = 0;
  local_70[3] = 0;
  local_70[4] = 0;
  local_70[5] = 0;
  local_70[6] = 0;
  local_70[7] = 0;
  local_70[8] = 0;
  local_70[9] = 0;
  local_70[10] = 0;
  local_70[0xb] = 0;
  local_70[0xc] = 0;
  local_70[0xd] = 0;
  local_70[0xe] = 0;
  local_70[0xf] = 0;
  local_70[0x10] = 0;
  local_70[0x11] = 0;
  local_70[0x12] = 0;
  local_70[0x13] = 0;
  local_70[0x14] = 0;
  local_b6[0] = 0x5a5a;
  local_b6[1] = 0x5a5a;
  local_b6[2] = 0x5a5a;
  iVar4 = 1000000;
  fVar6 = 0.0;
  do {
    dVar8 = (double)Imath_3_2::erand48(local_b6);
    fVar7 = (float)((1.0 - dVar8) * 0.0 + dVar8);
    local_a8[(int)(fVar7 * 10.0)] = local_a8[(int)(fVar7 * 10.0)] + 1;
    fVar6 = (fVar7 - fVar6) * 10.0 + 0.5;
    if (0.0 <= fVar6) {
      iVar1 = (int)fVar6;
    }
    else {
      fVar6 = -fVar6;
      iVar1 = -((uint)((float)(int)fVar6 < fVar6) + (int)fVar6);
    }
    local_70[(long)iVar1 + 10] = local_70[(long)iVar1 + 10] + 1;
    iVar4 = iVar4 + -1;
    fVar6 = fVar7;
  } while (iVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  values",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  lVar2 = 0;
  do {
    uVar3 = local_a8[lVar2] - 100000;
    uVar5 = -uVar3;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    if (999 < uVar5) {
      __assert_fail("abs (v[i] - M) < 0.01 * M",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                    ,0x8f,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  if (local_a8[10] != 0) {
    __assert_fail("v[N] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                  ,0x97,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  differences between successive values",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  lVar2 = 0;
  do {
    iVar1 = (int)lVar2 + -10;
    iVar4 = -iVar1;
    if (iVar1 < 1) {
      iVar4 = iVar1;
    }
    uVar3 = (iVar4 * 10000 - local_70[lVar2]) + 100000;
    uVar5 = -uVar3;
    if (0 < (int)uVar3) {
      uVar5 = uVar3;
    }
    if (4999 < uVar5) {
      __assert_fail("abs ((N - abs (i)) * M / N - d[i]) < 0.05 * M",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                    ,0x9e,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  range",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  iVar4 = 0x989681;
  dVar8 = 1.0;
  dVar10 = 0.0;
  do {
    local_b0 = dVar8;
    dVar9 = (double)Imath_3_2::erand48(local_b6);
    dVar9 = (1.0 - dVar9) * 0.0 + dVar9;
    dVar8 = dVar9;
    if (local_b0 <= dVar9) {
      dVar8 = local_b0;
    }
    if (dVar9 <= dVar10) {
      dVar9 = dVar10;
    }
    iVar4 = iVar4 + -1;
    dVar10 = dVar9;
  } while (iVar4 != 0);
  if ((dVar8 < 0.0001) && (0.9999 < dVar9)) {
    iVar4 = 0x989681;
    while( true ) {
      dVar8 = (double)Imath_3_2::erand48(local_b6);
      dVar8 = dVar8 * 3.0 - ((1.0 - dVar8) + (1.0 - dVar8));
      if ((dVar8 < -2.0) || (3.0 < dVar8)) {
        __assert_fail("r0 >= -2.0 && r0 <= 3.0",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                      ,0xbb,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]"
                     );
      }
      dVar8 = (double)Imath_3_2::erand48(local_b6);
      dVar8 = (1.0 - dVar8) * -1.152921504606847e+18 + dVar8;
      if ((dVar8 < -1.152921504606847e+18) || (1.0 < dVar8)) break;
      dVar8 = (double)Imath_3_2::erand48(local_b6);
      dVar8 = dVar8 * 1.152921504606847e+18 - (1.0 - dVar8);
      if ((dVar8 < -1.0) || (1.152921504606847e+18 < dVar8)) {
        __assert_fail("r2 >= -1 && r2 <= pow_2_60",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                      ,0xc1,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]"
                     );
      }
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        return;
      }
    }
    __assert_fail("r1 >= -pow_2_60 && r1 <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                  ,0xbe,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
  }
  __assert_fail("rMin < 0.0001 && rMax > 0.9999",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testRandom.cpp"
                ,0xb4,"void (anonymous namespace)::testGenerator() [Rand = Imath_3_2::Rand48]");
}

Assistant:

void
testGenerator ()
{
    //
    // Test if the values, and the differences between
    // successive values, are evenly distributed.
    //

    const int N = 10;
    const int M = 100000;

    int  values[N + 1];
    int  diffs[2 * N + 3];
    int* v = &values[0];
    int* d = &diffs[N + 2];

    for (int i = 0; i <= N; ++i)
        v[i] = 0;

    for (int i = -N; i <= N; ++i)
        d[i] = 0;

    Rand  rand (0);
    float previous = 0;

    for (int i = 0; i < M * N; ++i)
    {
        float r    = float(rand.nextf (0.0, 1.0));
        float diff = r - previous;
        previous   = r;

        v[int (r * N)] += 1;
        d[IMATH_INTERNAL_NAMESPACE::floor (diff * N + 0.5)] += 1;
    }

    cout << "  values" << endl;

    for (int i = 0; i < N; ++i)
    {
        // cout << setw (4) << i << ' ' << setw(6) << v[i] << ' ';
        assert (abs (v[i] - M) < 0.01 * M);

        // for (int j = 0; j < v[i] * 60 / M; ++j)
        //      cout << '*';

        // cout << endl;
    }

    assert (v[N] == 0);

    cout << "  differences between successive values" << endl;

    for (int i = -N; i <= N; ++i)
    {
        // cout << setw (4) << i << ' ' << setw (6) << d[i] << ' ';
        assert (abs ((N - abs (i)) * M / N - d[i]) < 0.05 * M);

        // for (int j = 0; j < d[i] * 60 / M; ++j)
        //     cout << '*';

        // cout << endl;
    }

    cout << "  range" << endl;

    double rMin = 1.0;
    double rMax = 0.0;

    for (int i = 0; i <= 10000000; ++i)
    {
        double r = rand.nextf (0.0, 1.0);

        if (rMin > r) rMin = r;

        if (rMax < r) rMax = r;
    }

    assert (rMin < 0.0001 && rMax > 0.9999);

    const double pow_2_60 = double (1073741824) * double (1073741824);

    for (int i = 0; i <= 10000000; ++i)
    {
        double r0 = rand.nextf (-2.0, 3.0);
        assert (r0 >= -2.0 && r0 <= 3.0);

        double r1 = rand.nextf (-pow_2_60, 1);
        assert (r1 >= -pow_2_60 && r1 <= 1);

        double r2 = rand.nextf (-1, pow_2_60);
        assert (r2 >= -1 && r2 <= pow_2_60);
    }
}